

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O1

void __thiscall QRhiWidget::~QRhiWidget(QRhiWidget *this)

{
  undefined1 *this_00;
  
  this_00 = &this[-1].super_QWidget.field_0x18;
  ~QRhiWidget((QRhiWidget *)this_00);
  operator_delete(this_00,0x28);
  return;
}

Assistant:

QRhiWidget::~QRhiWidget()
{
    Q_D(QRhiWidget);

    if (d->rhi) {
        d->rhi->removeCleanupCallback(this);
        // rhi resources must be destroyed here, due to how QWidget teardown works;
        // it should not be left to the private object's destruction.
        d->resetRenderTargetObjects();
        d->resetColorBufferObjects();
        qDeleteAll(d->pendingDeletes);
    }

    d->offscreenRenderer.reset();
}